

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_simplices_iterators.h
# Opt level: O3

void __thiscall
Gudhi::skeleton_blocker::
Simplex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::Simplex_iterator(Simplex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
                   *this,Complex *complex,bool end)

{
  list<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
  *plVar1;
  value_type vVar2;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  local_40 [2];
  
  this->complex_ = complex;
  (this->current_vertex_).complex =
       (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)0x0;
  (this->current_vertex_).vertexIterator.first.m_value = 0;
  (this->current_vertex_).vertexIterator.second.m_value = 0;
  (this->current_simplex_around_current_vertex_).complex = (Complex *)0x0;
  (this->current_simplex_around_current_vertex_).v.vertex = -1;
  plVar1 = &(this->current_simplex_around_current_vertex_).nodes_to_be_seen;
  (this->current_simplex_around_current_vertex_).link_v.
  super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->current_simplex_around_current_vertex_).link_v.
  super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->current_simplex_around_current_vertex_).trie.
  super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->current_simplex_around_current_vertex_).trie.
  super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->current_simplex_around_current_vertex_).nodes_to_be_seen.
  super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->current_simplex_around_current_vertex_).nodes_to_be_seen.
  super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->current_simplex_around_current_vertex_).nodes_to_be_seen.
  super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->simplices_around_current_vertex_end_).complex = (Complex *)0x0;
  (this->simplices_around_current_vertex_end_).v.vertex = -1;
  plVar1 = &(this->simplices_around_current_vertex_end_).nodes_to_be_seen;
  (this->simplices_around_current_vertex_end_).link_v.
  super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->simplices_around_current_vertex_end_).link_v.
  super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->simplices_around_current_vertex_end_).trie.
  super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->simplices_around_current_vertex_end_).trie.
  super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->simplices_around_current_vertex_end_).nodes_to_be_seen.
  super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->simplices_around_current_vertex_end_).nodes_to_be_seen.
  super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->simplices_around_current_vertex_end_).nodes_to_be_seen.
  super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  ::Vertex_iterator(local_40,complex);
  vVar2 = (long)(complex->skeleton).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(complex->skeleton).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start >> 6;
  (this->current_vertex_).complex = complex;
  (this->current_vertex_).vertexIterator.first.m_value = vVar2;
  (this->current_vertex_).vertexIterator.second.m_value = vVar2;
  return;
}

Assistant:

Simplex_iterator(const Complex* complex, bool end) :
      complex_(complex) {
    set_end();
  }